

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

int lj_trace_flushall(lua_State *L)

{
  uint64_t uVar1;
  GCtrace *T_00;
  TValue *pTVar2;
  ptrdiff_t argbase_00;
  GCstr *pGVar3;
  ptrdiff_t argbase;
  GCtrace *T;
  ptrdiff_t i;
  jit_State *J;
  lua_State *L_local;
  
  uVar1 = (L->glref).ptr64;
  if ((*(byte *)(uVar1 + 0x91) & 0x40) == 0) {
    T = (GCtrace *)(ulong)*(uint *)(uVar1 + 0x46c);
    while (T = (GCtrace *)&T[-1].field_0x77, 0 < (long)T) {
      T_00 = *(GCtrace **)(*(long *)(uVar1 + 0x460) + (long)T * 8);
      if (T_00 != (GCtrace *)0x0) {
        if (T_00->root == 0) {
          trace_flushroot((jit_State *)(uVar1 + 0x2e0),T_00);
        }
        T_00->link = 0;
        T_00->traceno = 0;
        *(undefined8 *)(*(long *)(uVar1 + 0x460) + (long)T * 8) = 0;
      }
    }
    *(undefined2 *)(uVar1 + 0x348) = 0;
    *(undefined4 *)(uVar1 + 0x468) = 0;
    memset((void *)(uVar1 + 0xa00),0,0x400);
    lj_mcode_free((jit_State *)(uVar1 + 0x2e0));
    memset((void *)(uVar1 + 0x980),0,0x80);
    if (((*(byte *)((L->glref).ptr64 + 0x93) & 2) != 0) &&
       (argbase_00 = lj_vmevent_prepare(L,LJ_VMEVENT_TRACE), argbase_00 != 0)) {
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pGVar3 = lj_str_new(L,"flush",5);
      pTVar2->u64 = (ulong)pGVar3 | 0xfffd800000000000;
      lj_vmevent_call(L,argbase_00);
    }
    L_local._4_4_ = 0;
  }
  else {
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

int lj_trace_flushall(lua_State *L)
{
  jit_State *J = L2J(L);
  ptrdiff_t i;
  if ((J2G(J)->hookmask & HOOK_GC))
    return 1;
  for (i = (ptrdiff_t)J->sizetrace-1; i > 0; i--) {
    GCtrace *T = traceref(J, i);
    if (T) {
      if (T->root == 0)
	trace_flushroot(J, T);
      lj_gdbjit_deltrace(J, T);
      T->traceno = T->link = 0;  /* Blacklist the link for cont_stitch. */
      setgcrefnull(J->trace[i]);
    }
  }
  J->cur.traceno = 0;
  J->freetrace = 0;
  /* Clear penalty cache. */
  memset(J->penalty, 0, sizeof(J->penalty));
  /* Free the whole machine code and invalidate all exit stub groups. */
  lj_mcode_free(J);
  memset(J->exitstubgroup, 0, sizeof(J->exitstubgroup));
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "flush"));
  );
  return 0;
}